

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

bool QFontDatabase::removeApplicationFallbackFontFamily(Script script,QString *familyName)

{
  ExtendedScript script_00;
  bool bVar1;
  Type *mutex;
  QDebug *this;
  undefined4 in_register_0000003c;
  long in_FS_OFFSET;
  QDebug local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)CONCAT44(in_register_0000003c,script));
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38,mutex);
  if (script - ScriptCount < 0xffffff57) {
    QtPrivateLogging::lcFontDb();
    if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledWarning._q_value._M_base.
               _M_i & 1) != 0) {
      QMessageLogger::warning();
      this = QDebug::operator<<(&local_40,
                                "Invalid script passed to removeApplicationFallbackFontFamily:");
      QDebug::operator<<(this,script);
      QDebug::~QDebug(&local_40);
    }
    bVar1 = false;
  }
  else {
    script_00 = Script_Common;
    if (script != Script_Latin) {
      script_00 = script;
    }
    QFontDatabasePrivate::instance();
    bVar1 = QFontDatabasePrivate::removeApplicationFallbackFontFamily
                      (&QFontDatabasePrivate::instance::instance,script_00,familyName);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::removeApplicationFallbackFontFamily(QChar::Script script, const QString &familyName)
{
    QMutexLocker locker(fontDatabaseMutex());

    if (script < QChar::Script_Common || script >= QChar::ScriptCount) {
        qCWarning(lcFontDb) << "Invalid script passed to removeApplicationFallbackFontFamily:" << script;
        return false;
    }

    if (script == QChar::Script_Latin)
        script = QChar::Script_Common;

    auto *db = QFontDatabasePrivate::instance();
    return db->removeApplicationFallbackFontFamily(QFontDatabasePrivate::ExtendedScript(script),
                                                   familyName);
}